

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O0

void clear_bypasses(void)

{
  obj *poVar1;
  monst *local_20;
  monst *mtmp;
  obj *nobj;
  obj *otmp;
  
  poVar1 = level->objlist;
  while (nobj = poVar1, nobj != (obj *)0x0) {
    poVar1 = nobj->nobj;
    if ((*(uint *)&nobj->field_0x4a >> 0x1a & 1) != 0) {
      *(uint *)&nobj->field_0x4a = *(uint *)&nobj->field_0x4a & 0xfbffffff;
    }
  }
  for (nobj = magic_chest_objs; nobj != (obj *)0x0; nobj = nobj->nobj) {
    *(uint *)&nobj->field_0x4a = *(uint *)&nobj->field_0x4a & 0xfbffffff;
  }
  for (local_20 = level->monlist; local_20 != (monst *)0x0; local_20 = local_20->nmon) {
    if (0 < local_20->mhp) {
      for (nobj = local_20->minvent; nobj != (obj *)0x0; nobj = nobj->nobj) {
        *(uint *)&nobj->field_0x4a = *(uint *)&nobj->field_0x4a & 0xfbffffff;
      }
    }
  }
  for (local_20 = migrating_mons; local_20 != (monst *)0x0; local_20 = local_20->nmon) {
    for (nobj = local_20->minvent; nobj != (obj *)0x0; nobj = nobj->nobj) {
      *(uint *)&nobj->field_0x4a = *(uint *)&nobj->field_0x4a & 0xfbffffff;
    }
  }
  flags.bypasses = '\0';
  return;
}

Assistant:

void clear_bypasses(void)
{
	struct obj *otmp, *nobj;
	struct monst *mtmp;

	for (otmp = level->objlist; otmp; otmp = nobj) {
	    nobj = otmp->nobj;
	    if (otmp->bypass) {
		otmp->bypass = 0;
		/* bypass will have inhibited any stacking, but since it's
		   used for polymorph handling, the objects here probably
		   have been transformed and won't be stacked in the usual
		   manner afterwards; so don't bother with this */
	    }
	}
	/* invent and mydogs chains shouldn't matter here */
	for (otmp = magic_chest_objs; otmp; otmp = otmp->nobj)
	    otmp->bypass = 0;
	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (DEADMONSTER(mtmp)) continue;
	    for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		otmp->bypass = 0;
	}
	for (mtmp = migrating_mons; mtmp; mtmp = mtmp->nmon) {
	    for (otmp = mtmp->minvent; otmp; otmp = otmp->nobj)
		otmp->bypass = 0;
	}
	flags.bypasses = FALSE;
}